

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

double xmlXPathCastToNumber(xmlXPathObjectPtr val)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  double dVar4;
  
  dVar4 = NAN;
  if (val != (xmlXPathObjectPtr)0x0) {
    switch(val->type) {
    case XPATH_UNDEFINED:
      break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      dVar4 = xmlXPathCastNodeSetToNumber(val->nodesetval);
      return dVar4;
    case XPATH_BOOLEAN:
      dVar4 = 0.0;
      if (val->boolval != 0) {
        return 1.0;
      }
      break;
    case XPATH_NUMBER:
      return val->floatval;
    case XPATH_STRING:
      dVar4 = xmlXPathStringEvalNumber(val->stringval);
      return dVar4;
    case XPATH_POINT:
    case XPATH_RANGE:
    case XPATH_LOCATIONSET:
    case XPATH_USERS:
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpath.c"
                ,0x1739);
      dVar4 = NAN;
      break;
    default:
      return 0.0;
    }
  }
  return dVar4;
}

Assistant:

double
xmlXPathCastToNumber(xmlXPathObjectPtr val) {
    double ret = 0.0;

    if (val == NULL)
	return(NAN);
    switch (val->type) {
    case XPATH_UNDEFINED:
#ifdef DEBUG_EXPR
	xmlGenericError(xmlGenericErrorContext, "NUMBER: undefined\n");
#endif
	ret = NAN;
	break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
	ret = xmlXPathCastNodeSetToNumber(val->nodesetval);
	break;
    case XPATH_STRING:
	ret = xmlXPathCastStringToNumber(val->stringval);
	break;
    case XPATH_NUMBER:
	ret = val->floatval;
	break;
    case XPATH_BOOLEAN:
	ret = xmlXPathCastBooleanToNumber(val->boolval);
	break;
    case XPATH_USERS:
    case XPATH_POINT:
    case XPATH_RANGE:
    case XPATH_LOCATIONSET:
	TODO;
	ret = NAN;
	break;
    }
    return(ret);
}